

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

char * arkLSGetReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  pcVar1 = (char *)malloc(0x1e);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1 + 6,"SUCCESS",8);
    uVar2 = 0x55535f534c4b5241;
    goto LAB_004f2fd0;
  case -0xc:
    builtin_strncpy(pcVar1,"ARKLS_SUNLS_FAIL",0x11);
    break;
  case -0xb:
    builtin_strncpy(pcVar1,"ARKLS_SUNMAT_FAIL",0x12);
    break;
  case -10:
    builtin_strncpy(pcVar1,"ARKLS_MASSFUNC_RECVR",0x15);
    break;
  case -9:
    builtin_strncpy(pcVar1,"ARKLS_MASSFUNC_UNRECVR",0x17);
    break;
  case -8:
    builtin_strncpy(pcVar1,"ARKLS_JACFUNC_RECVR",0x14);
    break;
  case -7:
    builtin_strncpy(pcVar1,"ARKLS_JACFUNC_UNRECVR",0x16);
    break;
  case -6:
    builtin_strncpy(pcVar1,"ARKLS_MASSMEM_NULL",0x13);
    break;
  default:
    builtin_strncpy(pcVar1,"NONE",5);
    break;
  case -4:
    uVar2 = 0x4c4941465f4d45;
    goto LAB_004f2fc2;
  case -3:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'I';
    uVar3._3_1_ = 'L';
    uVar4._0_1_ = 'L';
    uVar4._1_1_ = '_';
    uVar4._2_1_ = 'I';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'P';
    uVar5._1_1_ = 'U';
    uVar5._2_1_ = 'T';
    uVar5._3_1_ = '\0';
    goto LAB_004f3012;
  case -2:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'L';
    uVar3._3_1_ = 'M';
    uVar4._0_1_ = 'E';
    uVar4._1_1_ = 'M';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'U';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = '\0';
LAB_004f3012:
    pcVar1[0] = 'A';
    pcVar1[1] = 'R';
    pcVar1[2] = 'K';
    pcVar1[3] = 'L';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar4;
    *(undefined4 *)(pcVar1 + 0xc) = uVar5;
    break;
  case -1:
    uVar2 = 0x4c4c554e5f4d45;
LAB_004f2fc2:
    *(undefined8 *)(pcVar1 + 7) = uVar2;
    uVar2 = 0x454d5f534c4b5241;
LAB_004f2fd0:
    *(undefined8 *)pcVar1 = uVar2;
  }
  return pcVar1;
}

Assistant:

char *arkLSGetReturnFlagName(long int flag)
{
  char *name = (char *)malloc(30*sizeof(char));

  switch(flag) {
  case ARKLS_SUCCESS:
    sprintf(name,"ARKLS_SUCCESS");
    break;
  case ARKLS_MEM_NULL:
    sprintf(name,"ARKLS_MEM_NULL");
    break;
  case ARKLS_LMEM_NULL:
    sprintf(name,"ARKLS_LMEM_NULL");
    break;
  case ARKLS_ILL_INPUT:
    sprintf(name,"ARKLS_ILL_INPUT");
    break;
  case ARKLS_MEM_FAIL:
    sprintf(name,"ARKLS_MEM_FAIL");
    break;
  case ARKLS_MASSMEM_NULL:
    sprintf(name,"ARKLS_MASSMEM_NULL");
    break;
  case ARKLS_JACFUNC_UNRECVR:
    sprintf(name,"ARKLS_JACFUNC_UNRECVR");
    break;
  case ARKLS_JACFUNC_RECVR:
    sprintf(name,"ARKLS_JACFUNC_RECVR");
    break;
  case ARKLS_MASSFUNC_UNRECVR:
    sprintf(name,"ARKLS_MASSFUNC_UNRECVR");
    break;
  case ARKLS_MASSFUNC_RECVR:
    sprintf(name,"ARKLS_MASSFUNC_RECVR");
    break;
  case ARKLS_SUNMAT_FAIL:
    sprintf(name,"ARKLS_SUNMAT_FAIL");
    break;
  case ARKLS_SUNLS_FAIL:
    sprintf(name,"ARKLS_SUNLS_FAIL");
    break;
  default:
    sprintf(name,"NONE");
  }

  return(name);
}